

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ArgMinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_argmin(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x3fc) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3fc;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.argmin_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArgMinLayerParams>
                   (arena);
    (this->layer_).argmin_ = (ArgMinLayerParams *)LVar2;
  }
  return (ArgMinLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgMinLayerParams* NeuralNetworkLayer::_internal_mutable_argmin() {
  if (!_internal_has_argmin()) {
    clear_layer();
    set_has_argmin();
    layer_.argmin_ = CreateMaybeMessage< ::CoreML::Specification::ArgMinLayerParams >(GetArenaForAllocation());
  }
  return layer_.argmin_;
}